

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O1

sockaddr_in * PreGet(void *buffer,int bufferlen,bool noabort)

{
  int __errnum;
  ssize_t sVar1;
  int *piVar2;
  char *pcVar3;
  sockaddr_in *psVar4;
  socklen_t fromlen;
  socklen_t local_14;
  
  psVar4 = &PreGet::fromaddress;
  sVar1 = recvfrom(mysocket,buffer,(long)bufferlen,0,(sockaddr *)&PreGet::fromaddress,&local_14);
  if ((int)sVar1 == -1) {
    piVar2 = __errno_location();
    __errnum = *piVar2;
    if (__errnum == 0x68 && noabort || __errnum == 0xb) {
      psVar4 = (sockaddr_in *)0x0;
    }
    else {
      pcVar3 = strerror(__errnum);
      I_Error("PreGet: %s",pcVar3);
    }
  }
  return psVar4;
}

Assistant:

sockaddr_in *PreGet (void *buffer, int bufferlen, bool noabort)
{
	static sockaddr_in fromaddress;
	socklen_t fromlen;
	int c;

	fromlen = sizeof(fromaddress);
	c = recvfrom (mysocket, (char *)buffer, bufferlen, 0,
		(sockaddr *)&fromaddress, &fromlen);

	if (c == SOCKET_ERROR)
	{
		int err = WSAGetLastError();
		if (err == WSAEWOULDBLOCK || (noabort && err == WSAECONNRESET))
			return NULL;	// no packet
		I_Error ("PreGet: %s", neterror ());
	}
	return &fromaddress;
}